

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O3

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC1TL2SLTest
          (DatarateTestSVC *this)

{
  double *val1;
  bool bVar1;
  uint uVar2;
  ParamType *pPVar3;
  undefined8 *puVar4;
  pointer *__ptr;
  SEARCH_METHODS *pSVar5;
  long lVar6;
  long lVar7;
  AssertHelper local_c8;
  AssertHelper local_c0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,0x1e,1,0,300);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01003b10;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  pPVar3 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c4f6e8 +
                (long)(pPVar3->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])(this);
  this->number_temporal_layers_ = 1;
  this->number_spatial_layers_ = 2;
  uVar2 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate >> 1 & 0x3fffffff;
  this->target_layer_bitrate_[0] = uVar2;
  this->target_layer_bitrate_[1] = uVar2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&this->super_DatarateTest,&video);
    }
    bVar1 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar1 == false) {
      if (0 < this->number_spatial_layers_ * this->number_temporal_layers_) {
        lVar6 = 0;
        lVar7 = 0;
        do {
          val1 = (double *)((long)this->effective_datarate_tl + lVar6);
          local_c8.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[lVar7] * 0.8);
          testing::internal::CmpHelperGE<double,double>
                    ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 0.80",val1,(double *)&local_c8);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_c8.data_)->line,
                       " The datarate for the file is lower than target by too much!",0x3c);
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
              pSVar5 = "";
            }
            else {
              pSVar5 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0x5d5,(char *)pSVar5);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_c8.data_ + 8))();
            }
            puVar4 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar4 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar4 != puVar4 + 2) {
                operator_delete((undefined8 *)*puVar4);
              }
LAB_00601f35:
              operator_delete(puVar4);
            }
            break;
          }
          puVar4 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar4 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar4 != puVar4 + 2) {
              operator_delete((undefined8 *)*puVar4);
            }
            operator_delete(puVar4);
          }
          local_c8.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[lVar7] * 1.6);
          testing::internal::CmpHelperLE<double,double>
                    ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 1.60",val1,(double *)&local_c8);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_c8.data_)->line,
                       " The datarate for the file is greater than target by too much!",0x3e);
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
              pSVar5 = "";
            }
            else {
              pSVar5 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0x5d7,(char *)pSVar5);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_c8.data_ + 8))();
            }
            puVar4 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar4 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar4 != puVar4 + 2) {
                operator_delete((undefined8 *)*puVar4);
              }
              goto LAB_00601f35;
            }
            break;
          }
          puVar4 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar4 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar4 != puVar4 + 2) {
              operator_delete((undefined8 *)*puVar4);
            }
            operator_delete(puVar4);
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 8;
        } while (lVar7 < (long)this->number_spatial_layers_ * (long)this->number_temporal_layers_);
      }
      goto LAB_00601cbd;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
             ,0x5d3,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_00601cbd:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC1TL2SLTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;

    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);
    const int bitrate_array[2] = { 300, 600 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    number_temporal_layers_ = 1;
    number_spatial_layers_ = 2;
    target_layer_bitrate_[0] = 2 * cfg_.rc_target_bitrate / 4;
    target_layer_bitrate_[1] = 2 * cfg_.rc_target_bitrate / 4;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.80)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.60)
          << " The datarate for the file is greater than target by too much!";
    }
  }